

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

void __thiscall
chrono::ChOptimizerGenetic::ChOptimizerGenetic(ChOptimizerGenetic *this,ChOptimizerGenetic *other)

{
  ChGenotype *pCVar1;
  undefined1 auVar2 [32];
  
  ChOptimizer::ChOptimizer(&this->super_ChOptimizer,&other->super_ChOptimizer);
  (this->super_ChOptimizer)._vptr_ChOptimizer = (_func_int **)&PTR__ChOptimizerGenetic_00b62830;
  this->population = (ChGenotype **)0x0;
  pCVar1 = ChGenotype::Clone(other->best_indiv);
  this->best_indiv = pCVar1;
  *(undefined4 *)&(this->super_ChOptimizer).field_0x144 =
       *(undefined4 *)&(other->super_ChOptimizer).field_0x144;
  this->max_generations = other->max_generations;
  this->selection = other->selection;
  this->crossover = other->crossover;
  this->mutation = other->mutation;
  this->mutation_prob = other->mutation_prob;
  this->crossover_prob = other->crossover_prob;
  this->elite = other->elite;
  this->crossv_change = other->crossv_change;
  this->crossv_changeto = other->crossv_changeto;
  this->crossv_changewhen = other->crossv_changewhen;
  this->speciation_mating = other->speciation_mating;
  this->incest_taboo = other->incest_taboo;
  this->replacement = other->replacement;
  this->eugenetics = other->eugenetics;
  this->stop_by_stdeviation = other->stop_by_stdeviation;
  this->stop_stdeviation = other->stop_stdeviation;
  this->stop_by_fitness = other->stop_by_fitness;
  this->stop_fitness = other->stop_fitness;
  this->generations_done = 0;
  auVar2 = ZEXT832(0) << 0x20;
  this->average = (double)auVar2._0_8_;
  this->stdeviation = (double)auVar2._8_8_;
  this->min_fitness = (double)auVar2._16_8_;
  this->max_fitness = (double)auVar2._24_8_;
  this->his_average = (ChVectorDynamic<> *)auVar2._0_8_;
  this->his_stdeviation = (ChVectorDynamic<> *)auVar2._8_8_;
  this->his_maxfitness = (ChVectorDynamic<> *)auVar2._16_8_;
  this->his_minfitness = (ChVectorDynamic<> *)auVar2._24_8_;
  return;
}

Assistant:

ChOptimizerGenetic::ChOptimizerGenetic(const ChOptimizerGenetic& other) : ChOptimizer(other) {
    population = nullptr;
    best_indiv = other.best_indiv->Clone();

    popsize = other.popsize;
    max_generations = other.max_generations;
    selection = other.selection;
    crossover = other.crossover;
    mutation = other.mutation;
    mutation_prob = other.mutation_prob;
    crossover_prob = other.crossover_prob;
    elite = other.elite;
    crossv_change = other.crossv_change;
    crossv_changeto = other.crossv_changeto;
    crossv_changewhen = other.crossv_changewhen;
    speciation_mating = other.speciation_mating;
    incest_taboo = other.incest_taboo;
    replacement = other.replacement;
    eugenetics = other.eugenetics;

    stop_by_stdeviation = other.stop_by_stdeviation;
    stop_stdeviation = other.stop_stdeviation;
    stop_by_fitness = other.stop_by_fitness;
    stop_fitness = other.stop_fitness;

    average = 0;
    stdeviation = 0;
    min_fitness = 0;
    max_fitness = 0;
    generations_done = 0;

    his_average = nullptr;
    his_stdeviation = nullptr;
    his_maxfitness = nullptr;
    his_minfitness = nullptr;
}